

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Serialization_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Serialization_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type assertion_result;
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  key_type kVar2;
  char *message;
  AssertionResult *this_01;
  int iVar3;
  long in_RDI;
  value_type vVar4;
  value_type vVar5;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  TypeParam ht_in;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  int i;
  TypeParam ht_out;
  undefined4 in_stack_fffffffffffff9d8;
  int in_stack_fffffffffffff9dc;
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9e0;
  pair<const_std::pair<int,_int>,_int> *in_stack_fffffffffffff9e8;
  allocator_type *in_stack_fffffffffffff9f0;
  int iVar6;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9f8;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa00;
  size_type in_stack_fffffffffffffa08;
  Type TVar7;
  undefined4 in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa14;
  key_type *in_stack_fffffffffffffa18;
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa44;
  char *in_stack_fffffffffffffa48;
  char *in_stack_fffffffffffffa50;
  AssertionResult *in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  string local_528 [52];
  key_type local_4f4;
  undefined1 local_4e9;
  AssertionResult local_4e8;
  string local_4d8 [52];
  key_type local_4a4;
  undefined1 local_499;
  AssertionResult local_498 [2];
  key_type local_478;
  dense_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_470;
  value_type local_450;
  value_type local_440;
  AssertionResult local_430;
  string local_420 [52];
  key_type local_3ec;
  undefined1 local_3e1;
  AssertionResult local_3e0 [2];
  key_type local_3c0;
  dense_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_3b8;
  value_type local_398;
  value_type local_388;
  AssertionResult local_378 [2];
  key_type local_358;
  dense_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_350;
  value_type local_330;
  value_type local_320;
  AssertionResult local_310;
  string local_300 [55];
  undefined1 local_2c9;
  AssertionResult local_2c8;
  string local_2b8 [55];
  undefined1 local_281;
  AssertionResult local_280;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_270 [2];
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_248;
  string local_1c0 [55];
  undefined1 local_189;
  AssertionResult local_188;
  string local_178 [55];
  undefined1 local_141;
  AssertionResult local_140;
  FILE *local_130;
  key_type local_128;
  key_type local_120;
  value_type local_f0;
  value_type local_e0;
  int local_d0;
  key_type local_cc;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b8 [2];
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_90;
  
  bVar1 = google::
          HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_b8,0,(int *)0x0);
    google::
    HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashMap
              ((HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               in_stack_fffffffffffffa08,(hasher *)in_stack_fffffffffffffa00,
               (key_equal *)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_b8);
    local_cc = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffff9f8,(int)((ulong)in_stack_fffffffffffff9f0 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key(in_stack_fffffffffffff9e0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
    for (local_d0 = 1; local_d0 < 100; local_d0 = local_d0 + 1) {
      vVar4 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffa00,
                             (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
      local_f0 = vVar4;
      local_e0 = vVar4;
      google::
      BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               (value_type *)in_stack_fffffffffffffa58);
    }
    local_120 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9f8,
                            (int)((ulong)in_stack_fffffffffffff9f0 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffff9e0,
            (key_type *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
    local_128 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9f8,
                            (int)((ulong)in_stack_fffffffffffff9f0 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffff9e0,
            (key_type *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
    local_130 = tmpfile();
    local_141 = local_130 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9e0,
               (bool *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (type *)0xf56e91);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                 (char *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 (Type)(in_stack_fffffffffffffa08 >> 0x20),(char *)in_stack_fffffffffffffa00,
                 (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),(char *)in_stack_fffffffffffff9f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 (Message *)in_stack_fffffffffffffa58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9e0);
      std::__cxx11::string::~string(local_178);
      testing::Message::~Message((Message *)0xf56f54);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf56fe8);
    local_189 = google::
                BaseHashtableInterface<google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
                ::serialize<ValueSerializer,_IO_FILE>(&local_90,local_130);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9e0,
               (bool *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (type *)0xf5702f);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                 (char *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                 (Type)(in_stack_fffffffffffffa08 >> 0x20),(char *)in_stack_fffffffffffffa00,
                 (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),(char *)in_stack_fffffffffffff9f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 (Message *)in_stack_fffffffffffffa58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9e0);
      std::__cxx11::string::~string(local_1c0);
      testing::Message::~Message((Message *)0xf57104);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf5719b);
    rewind(local_130);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_270,0,(int *)0x0);
    google::
    HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashMap
              ((HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
               in_stack_fffffffffffffa08,(hasher *)in_stack_fffffffffffffa00,
               (key_equal *)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
    TVar7 = (Type)(in_stack_fffffffffffffa08 >> 0x20);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_270);
    local_281 = local_130 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9e0,
               (bool *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (type *)0xf57243);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_280);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                 (char *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),TVar7
                 ,(char *)in_stack_fffffffffffffa00,(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
                 (char *)in_stack_fffffffffffff9f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 (Message *)in_stack_fffffffffffffa58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9e0);
      std::__cxx11::string::~string(local_2b8);
      testing::Message::~Message((Message *)0xf57357);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf573eb);
    local_2c9 = google::
                BaseHashtableInterface<google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
                ::unserialize<ValueSerializer,_IO_FILE>(&local_248,local_130);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9e0,
               (bool *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (type *)0xf57432);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                 (char *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),TVar7
                 ,(char *)in_stack_fffffffffffffa00,(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
                 (char *)in_stack_fffffffffffff9f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 (Message *)in_stack_fffffffffffffa58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9e0);
      std::__cxx11::string::~string(local_300);
      testing::Message::~Message((Message *)0xf57507);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf5759e);
    fclose(local_130);
    local_330 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffa00,
                               (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
    iVar3 = local_330.second;
    local_320 = local_330;
    assertion_result =
         HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey(in_stack_fffffffffffff9f8,(int)((ulong)in_stack_fffffffffffff9f0 >> 0x20));
    local_358 = assertion_result;
    google::
    BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    google::
    dense_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_350);
    testing::internal::EqHelper::
    Compare<std::pair<const_std::pair<int,_int>,_int>,_std::pair<const_std::pair<int,_int>,_int>,_nullptr>
              ((char *)in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0,
               in_stack_fffffffffffff9e8,
               (pair<const_std::pair<int,_int>,_int> *)in_stack_fffffffffffff9e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_310);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      in_stack_fffffffffffffa50 =
           testing::AssertionResult::failure_message((AssertionResult *)0xf576d2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),TVar7
                 ,(char *)in_stack_fffffffffffffa00,(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
                 (char *)in_stack_fffffffffffff9f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(iVar3,in_stack_fffffffffffffa60),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9e0);
      testing::Message::~Message((Message *)0xf5772f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf577a0);
    vVar4 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffffa00,(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20)
                          );
    local_398 = vVar4;
    local_388 = vVar4;
    local_3c0 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9f8,
                            (int)((ulong)in_stack_fffffffffffff9f0 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    google::
    dense_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_3b8);
    testing::internal::EqHelper::
    Compare<std::pair<const_std::pair<int,_int>,_int>,_std::pair<const_std::pair<int,_int>,_int>,_nullptr>
              ((char *)in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0,
               in_stack_fffffffffffff9e8,
               (pair<const_std::pair<int,_int>,_int> *)in_stack_fffffffffffff9e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_378);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      testing::AssertionResult::failure_message((AssertionResult *)0xf578b3);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),TVar7
                 ,(char *)in_stack_fffffffffffffa00,(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
                 (char *)in_stack_fffffffffffff9f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(iVar3,in_stack_fffffffffffffa60),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9e0);
      testing::Message::~Message((Message *)0xf57910);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf57981);
    local_3ec = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9f8,
                            (int)((ulong)in_stack_fffffffffffff9f0 >> 0x20));
    this_00 = (BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)google::
                 BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::count(in_stack_fffffffffffff9e0,
                         (key_type *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
    local_3e1 = this_00 ==
                (BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9e0,
               (bool *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (type *)0xf579ec);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3e0);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,in_stack_fffffffffffffa50,(char *)vVar4.first,
                 (char *)CONCAT44(vVar4.second,in_stack_fffffffffffffa40));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),TVar7
                 ,(char *)in_stack_fffffffffffffa00,(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
                 (char *)in_stack_fffffffffffff9f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(iVar3,in_stack_fffffffffffffa60),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9e0);
      std::__cxx11::string::~string(local_420);
      testing::Message::~Message((Message *)0xf57ac1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf57b58);
    vVar5 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffffa00,(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20)
                          );
    local_450 = vVar5;
    local_440 = vVar5;
    kVar2 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9f8,(int)((ulong)in_stack_fffffffffffff9f0 >> 0x20));
    local_478 = kVar2;
    google::
    BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(this_00,(key_type *)vVar5.first);
    TVar7 = kVar2.second;
    google::
    dense_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_470);
    testing::internal::EqHelper::
    Compare<std::pair<const_std::pair<int,_int>,_int>,_std::pair<const_std::pair<int,_int>,_int>,_nullptr>
              ((char *)in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0,
               in_stack_fffffffffffff9e8,
               (pair<const_std::pair<int,_int>,_int> *)in_stack_fffffffffffff9e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_430);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(vVar5.second,in_stack_fffffffffffffa10));
      in_stack_fffffffffffffa00 =
           (HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xf57c6b);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(vVar5.second,in_stack_fffffffffffffa10),TVar7,
                 (char *)in_stack_fffffffffffffa00,(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
                 (char *)in_stack_fffffffffffff9f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(iVar3,in_stack_fffffffffffffa60),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9e0);
      testing::Message::~Message((Message *)0xf57cc8);
    }
    iVar6 = (int)((ulong)in_stack_fffffffffffff9f0 >> 0x20);
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf57d39);
    kVar2 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9f8,iVar6);
    local_4a4 = kVar2;
    message = (char *)google::
                      BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::count(in_stack_fffffffffffff9e0,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
    local_499 = message == (char *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9e0,
               (bool *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (type *)0xf57da4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_498);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(vVar5.second,in_stack_fffffffffffffa10));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,in_stack_fffffffffffffa50,(char *)vVar4.first,
                 (char *)CONCAT44(vVar4.second,in_stack_fffffffffffffa40));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(vVar5.second,in_stack_fffffffffffffa10),TVar7,
                 (char *)in_stack_fffffffffffffa00,kVar2.second,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(iVar3,in_stack_fffffffffffffa60),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9e0);
      std::__cxx11::string::~string(local_4d8);
      testing::Message::~Message((Message *)0xf57e79);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf57f10);
    local_4f4 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)kVar2,(int)((ulong)message >> 0x20));
    iVar6 = kVar2.second;
    this_01 = (AssertionResult *)
              google::
              BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff9e0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
    local_4e9 = this_01 == (AssertionResult *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              (this_01,(bool *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (type *)0xf57f7b);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e8);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(vVar5.second,in_stack_fffffffffffffa10));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,in_stack_fffffffffffffa50,(char *)vVar4.first,
                 (char *)CONCAT44(vVar4.second,in_stack_fffffffffffffa40));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(vVar5.second,in_stack_fffffffffffffa10),TVar7,
                 (char *)in_stack_fffffffffffffa00,iVar6,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(iVar3,in_stack_fffffffffffffa60),
                 (Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
      std::__cxx11::string::~string(local_528);
      testing::Message::~Message((Message *)0xf58050);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf580e4);
    google::
    HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashMap
              ((HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf580f1);
    google::
    HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashMap
              ((HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf580fe);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Serialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(ValueSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(ValueSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}